

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::Matcher::PopAssertion
          (Matcher *this,CharCount *inputOffset,uint8 **instPointer,ContStack *contStack,
          AssertionStack *assertionStack,bool succeeded)

{
  code *pcVar1;
  bool bVar2;
  AssertionInfo *pAVar3;
  undefined4 *puVar4;
  BeginAssertionInst *pBVar5;
  uint8 *puVar6;
  BeginAssertionInst *begin;
  AssertionInfo *info;
  bool succeeded_local;
  AssertionStack *assertionStack_local;
  ContStack *contStack_local;
  uint8 **instPointer_local;
  CharCount *inputOffset_local;
  Matcher *this_local;
  
  pAVar3 = ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Top
                     (&assertionStack->
                       super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>);
  if (pAVar3 == (AssertionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                       ,0xce,"(info != 0)","info != 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>::Pop
            (&assertionStack->
              super_ContinuousPageStackOfFixedElements<UnifiedRegex::AssertionInfo,_1UL>);
  pBVar5 = LabelToInstPointer<UnifiedRegex::BeginAssertionInst>
                     (this,BeginAssertion,pAVar3->beginLabel);
  if (this->w != (Type)0x0) {
    DebugWriter::PrintEOL(this->w,L"POP TO %llu",pAVar3->contStackPosition);
  }
  ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::PopTo
            (&contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>,
             pAVar3->contStackPosition);
  if ((succeeded) && (((pBVar5->super_NegationMixin).isNegation & 1U) != 0)) {
    ResetInnerGroups(this,(pBVar5->super_BodyGroupsMixin).minBodyGroupId,
                     (pBVar5->super_BodyGroupsMixin).maxBodyGroupId);
  }
  bVar2 = succeeded != (bool)((pBVar5->super_NegationMixin).isNegation & 1U);
  if (bVar2) {
    *inputOffset = pAVar3->startInputOffset;
    puVar6 = LabelToInstPointer(this,(pBVar5->super_NextLabelMixin).nextLabel);
    *instPointer = puVar6;
  }
  return bVar2;
}

Assistant:

inline bool Matcher::PopAssertion(CharCount &inputOffset, const uint8 *&instPointer, ContStack &contStack, AssertionStack &assertionStack, bool succeeded)
    {
        AssertionInfo* info = assertionStack.Top();
        Assert(info != 0);
        assertionStack.Pop();
        BeginAssertionInst* begin = L2I(BeginAssertion, info->beginLabel);

        // Cut the existing continuations (we never backtrack into an assertion)
        // NOTE: We don't include the effective pops in the stats
#if ENABLE_REGEX_CONFIG_OPTIONS
        if (w != 0)
        {
            w->PrintEOL(_u("POP TO %llu"), (unsigned long long)info->contStackPosition);
        }
#endif
        contStack.PopTo(info->contStackPosition);

        // succeeded  isNegation  action
        // ---------  ----------  ----------------------------------------------------------------------------------
        // false      false       Fail into outer continuations (inner group bindings will have been undone)
        // true       false       Jump to next label (inner group bindings are now frozen)
        // false      true        Jump to next label (inner group bindings will have been undone and are now frozen)
        // true       true        Fail into outer continuations (inner group binding MUST BE CLEARED)

        if (succeeded && begin->isNegation)
        {
            ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
        }

        if (succeeded == begin->isNegation)
        {
            // Assertion failed
            return false;
        }
        else
        {
            // Continue with next label but from original input position
            inputOffset = info->startInputOffset;
            instPointer = LabelToInstPointer(begin->nextLabel);

            return true;
        }
    }